

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Time.cpp
# Opt level: O1

void sznet::sz_sleep(int millisec)

{
  undefined1 auStack_18 [8];
  timespec ts;
  
  auStack_18 = (undefined1  [8])(long)(millisec / 1000);
  ts.tv_sec = (__time_t)((millisec % 1000) * 1000000);
  nanosleep((timespec *)auStack_18,(timespec *)0x0);
  return;
}

Assistant:

void sz_sleep(int millisec)
{
#if SZ_OS_LINUX
	struct timespec ts {};
	ts.tv_sec = millisec / 1000;
	ts.tv_nsec = (millisec % 1000) * 1000000;
	nanosleep(&ts, nullptr);
#else
	Sleep(millisec);
#endif
}